

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O2

int dog_eat(monst *mtmp,obj *obj,int x,int y,boolean devour)

{
  int *piVar1;
  boolean bVar2;
  undefined4 in_EAX;
  uint uVar3;
  int iVar4;
  uint uVar5;
  obj *poVar6;
  permonst *ppVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  undefined7 in_register_00000081;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  obj *obj_00;
  
  uVar14 = CONCAT44((int)CONCAT71(in_register_00000081,devour),in_EAX);
  ppVar7 = mtmp->data;
  if (ppVar7->mlet == '0') {
    bVar10 = false;
  }
  else {
    bVar10 = ppVar7 != mons + 0x85 && (ppVar7->mflags2 & 0x100) == 0;
  }
  if (*(uint *)((long)&mtmp[1].data + 4) < moves) {
    *(uint *)((long)&mtmp[1].data + 4) = moves;
  }
  uVar3 = dog_nutrition(mtmp,obj);
  uVar5 = (uint)(ushort)obj->otyp;
  uVar14 = CONCAT53((int5)((ulong)uVar14 >> 0x18),CONCAT12(1,(short)uVar14));
  uVar8 = (ushort)obj->otyp - 0x10e;
  if (uVar8 < 0x1c) {
    bVar13 = true;
    if ((0x8000003U >> (uVar8 & 0x1f) & 1) != 0) {
      iVar4 = pm_to_cham(obj->corpsenm);
      bVar13 = iVar4 == 0;
      uVar5 = (uint)(ushort)obj->otyp;
    }
  }
  else {
    bVar13 = true;
  }
  uVar15 = CONCAT44((int)((ulong)uVar14 >> 0x20),CONCAT13(bVar13,(int3)uVar14));
  uVar5 = uVar5 - 0x10e;
  if ((uVar5 < 0x1c) && ((0x8000003U >> (uVar5 & 0x1f) & 1) != 0)) {
    uVar15 = CONCAT53((int5)((ulong)uVar15 >> 0x18),CONCAT12(obj->corpsenm != 0xec,(short)uVar14));
  }
  bVar13 = true;
  if ((uVar5 < 0x1c) && ((0x8000003U >> (uVar5 & 0x1f) & 1) != 0)) {
    bVar13 = obj->corpsenm != 0x119;
  }
  if ((char)((ulong)uVar15 >> 0x20) != '\0') {
    if (1 < mtmp->meating) {
      mtmp->meating = (uint)mtmp->meating >> 1;
    }
    if (1 < (int)uVar3) {
      uVar3 = uVar3 * 3 >> 2;
    }
  }
  obj_00 = (obj *)CONCAT62((int6)((ulong)uVar15 >> 0x10),CONCAT11(bVar13,(char)uVar15));
  if (!bVar10) {
    mtmp->meating = (mtmp->meating + 4) / 5;
    uVar3 = (int)(uVar3 + 4) / 5;
  }
  piVar1 = (int *)((long)&mtmp[1].data + 4);
  *piVar1 = *piVar1 + uVar3;
  uVar3 = *(uint *)&mtmp->field_0x60;
  iVar4 = *(int *)&mtmp[1].minvent;
  *(uint *)&mtmp->field_0x60 = uVar3 & 0xffdfffff;
  if (iVar4 != 0) {
    mtmp->mhpmax = mtmp->mhpmax + iVar4;
    *(undefined4 *)&mtmp[1].minvent = 0;
  }
  if (((uVar3 >> 0x10 & 1) != 0) && (1 < mtmp->mfleetim)) {
    mtmp->mfleetim = mtmp->mfleetim >> 1;
  }
  if (mtmp->mtame < '\x14') {
    mtmp->mtame = mtmp->mtame + '\x01';
  }
  if ((mtmp->mx != x) || (mtmp->my != y)) {
    newsym(x,y);
    newsym((int)mtmp->mx,(int)mtmp->my);
  }
  bVar2 = is_pool(level,x,y);
  if (((bVar2 == '\0') || ((u._1052_1_ & 2) != 0)) &&
     (((viz_array[y][x] & 2U) != 0 || ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)))) {
    uVar3 = *(uint *)&mtmp->field_0x60;
    if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar3 & 0x280) == 0) goto LAB_001718e8;
LAB_001718fe:
      pcVar12 = "It";
    }
    else {
      pcVar12 = "It";
      if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001718e8:
        if ((u._1052_1_ & 0x20) != 0) goto LAB_001718fe;
        pcVar12 = noit_Monnam(mtmp);
      }
    }
    pcVar9 = "devours";
    if ((char)((ulong)obj_00 >> 0x20) == '\0') {
      pcVar9 = "eats";
    }
    pcVar11 = "drains";
    if (bVar10) {
      pcVar11 = pcVar9;
    }
    if (obj->oclass == '\a') {
      pcVar9 = singular(obj,doname);
    }
    else {
      pcVar9 = doname(obj);
    }
    pline("%s %s %s.",pcVar12,pcVar11,pcVar9);
  }
  iVar4 = dogfood(mtmp,obj);
  if ((iVar4 == 0) && (obj->invlet != '\0')) {
    piVar1 = (int *)((long)&mtmp[1].nmon + 4);
    *piVar1 = *piVar1 + SUB164((ZEXT816(0) << 0x40 | ZEXT816(200)) /
                               SEXT816((long)(((ulong)moves + (ulong)*(uint *)&mtmp[1].nmon) -
                                             (ulong)*(uint *)&mtmp->field_0x74)),0);
  }
  if ((mtmp->data != mons + 0xd9) || ((*(uint *)&obj->field_0x4a >> 0xc & 1) == 0)) {
    if (!bVar10) {
      if (1 < obj->quan) {
        if (obj->where == '\x03') {
          obj = splitobj(obj,(ulong)(obj->quan - 1));
          freeinv(obj);
          iVar4 = inv_cnt();
          if ((iVar4 < 0x34) || (poVar6 = merge_choice(invent,obj), poVar6 != (obj *)0x0)) {
            obj = addinv(obj_00);
          }
          else {
            dropy(obj);
          }
        }
        else {
          splitobj(obj,1);
        }
      }
      obj->oeaten = (uint)(((ulong)mons[obj->corpsenm].cnutrit << 2) / 5);
      obj->field_0x4d = obj->field_0x4d | 8;
      goto LAB_00171aea;
    }
    if (uball == obj) {
      unpunish();
    }
    else {
      if (uchain == obj) {
        unpunish();
        goto LAB_00171aea;
      }
      if ((1 < obj->quan) && (obj->oclass == '\a')) {
        obj->quan = obj->quan + -1;
        uVar3 = weight(obj);
        obj->owt = uVar3;
        goto LAB_00171aea;
      }
    }
    delobj(obj);
    goto LAB_00171aea;
  }
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffefff;
  uVar3 = *(uint *)&mtmp->field_0x60 | 0x100000;
  *(uint *)&mtmp->field_0x60 = uVar3;
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00171bd3;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00171bca;
      }
      else {
LAB_00171bca:
        if (ublindf == (obj *)0x0) goto LAB_00171aea;
LAB_00171bd3:
        if (ublindf->oartifact != '\x1d') goto LAB_00171aea;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)
          ) || ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_00171aea;
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_00171aea;
    uVar3 = *(uint *)&mtmp->field_0x60;
  }
  if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar3 & 0x280) != 0) goto LAB_00171aea;
  }
  else if (((uVar3 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00171aea;
  if (((u._1052_1_ & 0x20) == 0) && (flags.verbose != '\0')) {
    pcVar12 = Monnam(mtmp);
    pcVar9 = distant_name(obj,doname);
    pline("%s spits %s out in disgust!",pcVar12,pcVar9);
  }
LAB_00171aea:
  if ((char)((ulong)obj_00 >> 0x18) == '\0') {
    newcham(level,mtmp,(permonst *)0x0,'\0',viz_array[mtmp->my][mtmp->mx] & 2);
  }
  if (((char)((ulong)obj_00 >> 0x10) == '\0') && ((int)(uint)mtmp->m_lev < mtmp->data->mlevel + 0xf)
     ) {
    ppVar7 = grow_up(mtmp,(monst *)0x0);
    if (((ulong)obj_00 & 0x100) != 0 || ppVar7 == (permonst *)0x0) {
      return (ppVar7 == (permonst *)0x0) + 1;
    }
  }
  else if ((char)((ulong)obj_00 >> 8) != '\0') {
    return 1;
  }
  mtmp->mhp = mtmp->mhpmax;
  return 1;
}

Assistant:

int dog_eat(struct monst *mtmp, struct obj *obj, int x, int y, boolean devour)
{
	struct edog *edog = EDOG(mtmp);
	boolean poly = FALSE, grow = FALSE, heal = FALSE;
	int nutrit;
	boolean vampiric = is_vampiric(mtmp->data);

	if (edog->hungrytime < moves)
	    edog->hungrytime = moves;
	nutrit = dog_nutrition(mtmp, obj);
	poly = polyfodder(obj);
	grow = mlevelgain(obj);
	heal = mhealup(obj);
	if (devour) {
	    if (mtmp->meating > 1) mtmp->meating /= 2;
	    if (nutrit > 1) nutrit = (nutrit * 3) / 4;
	}

	/* vampires only get 1/5 normal nutrition */
	if (vampiric) {
	    mtmp->meating = (mtmp->meating + 4) / 5;
	    nutrit = (nutrit + 4) / 5;
	}

	edog->hungrytime += nutrit;
	mtmp->mconf = 0;
	if (edog->mhpmax_penalty) {
	    /* no longer starving */
	    mtmp->mhpmax += edog->mhpmax_penalty;
	    edog->mhpmax_penalty = 0;
	}
	if (mtmp->mflee && mtmp->mfleetim > 1) mtmp->mfleetim /= 2;
	if (mtmp->mtame < 20) mtmp->mtame++;
	if (x != mtmp->mx || y != mtmp->my) {	/* moved & ate on same turn */
	    newsym(x, y);
	    newsym(mtmp->mx, mtmp->my);
	}
	if (is_pool(level, x, y) && !Underwater) {
	    /* Don't print obj */
	    /* TODO: Reveal presence of sea monster (especially sharks) */
	} else
	/* hack: observe the action if either new or old location is in view */
	/* However, invisible monsters should still be "it" even though out of
	   sight locations should not. */
	if (cansee(x, y) || cansee(mtmp->mx, mtmp->my))
	    pline("%s %s %s.", mon_visible(mtmp) ? noit_Monnam(mtmp) : "It",
		  vampiric ? "drains" : devour ? "devours" : "eats",
		  (obj->oclass == FOOD_CLASS) ?
			singular(obj, doname) : doname(obj));
	/* It's a reward if it's DOGFOOD and the player dropped/threw it. */
	/* We know the player had it if invlet is set -dlc */
	if (dogfood(mtmp,obj) == DOGFOOD && obj->invlet)
	    edog->apport += (int)(200L/
		((long)edog->dropdist + moves - edog->droptime));

	if (mtmp->data == &mons[PM_RUST_MONSTER] && obj->oerodeproof) {
	    /* The object's rustproofing is gone now */
	    obj->oerodeproof = 0;
	    mtmp->mstun = 1;
	    if (canseemon(level, mtmp) && flags.verbose) {
		pline("%s spits %s out in disgust!",
		      Monnam(mtmp), distant_name(obj,doname));
	    }
	} else if (vampiric) {
	    /* split object */
	    if (obj->quan > 1L) {
		if (!carried(obj)) {
		    splitobj(obj, 1L);
		} else  {
		    /* carried */
		    obj = splitobj(obj, obj->quan - 1L);

		    freeinv(obj);
		    if (inv_cnt() >= 52 && !merge_choice(invent, obj))
			dropy(obj);
		    else
			obj = addinv(obj);	/* unlikely but a merge is possible */
		}
	    }

	    /* take away blood nutrition */
	    obj->oeaten = drainlevel(obj);
	    obj->odrained = 1;
	} else if (obj == uball) {
	    unpunish();
	    delobj(obj);
	} else if (obj == uchain)
	    unpunish();
	else if (obj->quan > 1L && obj->oclass == FOOD_CLASS) {
	    obj->quan--;
	    obj->owt = weight(obj);
	} else
	    delobj(obj);

	if (poly) {
	    newcham(level, mtmp, NULL, FALSE,
			   cansee(mtmp->mx, mtmp->my));
	}
	/* limit "instant" growth to prevent potential abuse */
	if (grow && (int) mtmp->m_lev < (int)mtmp->data->mlevel + 15) {
	    if (!grow_up(mtmp, NULL)) return 2;
	}
	if (heal) mtmp->mhp = mtmp->mhpmax;
	return 1;
}